

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  char *__s;
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iData1;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *__dest;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  long lVar10;
  Gia_Obj_t *pObj_2;
  uint uVar11;
  Gia_Obj_t *pObj;
  uint uVar12;
  Gia_Obj_t *pObj_1;
  long lVar13;
  Gia_Obj_t *pObj_3;
  uint local_5c;
  uint local_58;
  uint local_54;
  
  p_00 = Gia_ManStart(p->nObjs * 9);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      iVar3 = pVVar8->pArray[lVar10];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0053382c;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar7 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar5 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar5)) goto LAB_0053380d;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar5 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar5)) goto LAB_0053380d;
      pGVar1[iVar3].Value = (int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
      pVVar8 = p->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  if (p->nObjs < 1) {
    uVar12 = 0;
  }
  else {
    lVar13 = 0;
    lVar10 = 8;
    uVar12 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(uint *)((long)pGVar1 + lVar10 + -8);
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        if (((int)uVar12 < 0) || (vMap->nSize <= (int)uVar12)) {
LAB_0053384b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = vMap->pArray[uVar12];
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar7 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
        uVar7 = uVar7 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          if ((pGVar6 < p_00->pObjs) || (local_54 = 0, p_00->pObjs + p_00->nObjs <= pGVar6))
          goto LAB_0053380d;
        }
        else {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) {
LAB_0053380d:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          local_54 = (int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)(uVar12 + 1)) goto LAB_0053384b;
        iVar3 = vMap->pArray[uVar12 + 1];
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar7 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
        uVar7 = uVar7 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          if ((pGVar6 < p_00->pObjs) || (local_58 = 0, p_00->pObjs + p_00->nObjs <= pGVar6))
          goto LAB_0053380d;
        }
        else {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          local_58 = (int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)(uVar12 + 2)) goto LAB_0053384b;
        iVar3 = vMap->pArray[uVar12 + 2];
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar7 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
        uVar7 = uVar7 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          if ((pGVar6 < p_00->pObjs) || (local_5c = 0, p_00->pObjs + p_00->nObjs <= pGVar6))
          goto LAB_0053380d;
        }
        else {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          local_5c = (int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)(uVar12 + 3)) goto LAB_0053384b;
        iVar3 = vMap->pArray[uVar12 + 3];
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar7 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
        uVar7 = uVar7 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          if ((pGVar6 < p_00->pObjs) || (uVar11 = 0, p_00->pObjs + p_00->nObjs <= pGVar6))
          goto LAB_0053380d;
        }
        else {
          *(ulong *)pGVar6 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar7;
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar6)) goto LAB_0053380d;
          uVar11 = (int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * 0x55555556;
        }
        uVar7 = *(ulong *)((long)pGVar1 + lVar10 + -8);
        uVar2 = (uint)uVar7;
        if ((uVar2 >> 0x1d & 1) == 0) {
LAB_0053360d:
          if ((uVar7 & 0x2000000000000000) == 0) {
            if ((uVar2 >> 0x1d & 1) != 0) goto LAB_00533647;
            if ((int)uVar11 < 0) goto LAB_00533889;
            uVar11 = uVar11 | 1;
          }
          else {
            if ((int)local_58 < 0) goto LAB_00533889;
            local_58 = local_58 | 1;
          }
        }
        else if ((uVar7 & 0x2000000000000000) == 0) {
          if ((uVar2 >> 0x1d & 1) == 0) goto LAB_0053360d;
LAB_00533647:
          if ((int)local_5c < 0) {
LAB_00533889:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf4,"int Abc_LitNot(int)");
          }
          local_5c = local_5c | 1;
        }
        else {
          if ((int)local_54 < 0) goto LAB_00533889;
          local_54 = local_54 | 1;
        }
        uVar12 = uVar12 + 4;
        iVar3 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                            (ulong)((uVar2 & 0x1fffffff) << 2) * -3 + lVar10),
                               local_58,local_54);
        iData1 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                             (ulong)((*(uint *)((long)pGVar1 + lVar10 + -8) &
                                                     0x1fffffff) << 2) * -3 + lVar10),uVar11,
                                local_5c);
        iVar3 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                            (ulong)((*(uint *)((long)pGVar1 + lVar10 + -4) &
                                                    0x1fffffff) << 2) * -3 + lVar10),iData1,iVar3);
        *(int *)(&pGVar1->field_0x0 + lVar10) = iVar3;
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar13 < p->nObjs);
  }
  if (uVar12 != vMap->nSize) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x208,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      iVar3 = pVVar8->pArray[lVar10];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_0053382c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar3;
      if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
                                    pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value
                              );
      pGVar1->Value = uVar12;
      lVar10 = lVar10 + 1;
      pVVar8 = p->vCos;
    } while (lVar10 < pVVar8->nSize);
  }
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar3 = p->vCis->nSize;
  if (pGVar9->vCis->nSize - pGVar9->nRegs != iVar3 + (~(p->vCos->nSize + iVar3) + p->nObjs) * 4) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x20d,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}